

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

_Bool mpack_tree_reserve_fill(mpack_tree_parser_t *parser,size_t bytes)

{
  mpack_tree_t *tree_00;
  mpack_error_t mVar1;
  size_t sVar2;
  char *local_48;
  size_t read;
  char *new_buffer;
  size_t new_capacity;
  mpack_tree_t *tree;
  size_t bytes_local;
  mpack_tree_parser_t *parser_local;
  
  tree_00 = parser->tree;
  if (tree_00->max_size < tree_00->data_length + bytes) {
    mpack_tree_flag_error(parser->tree,mpack_error_too_big);
    parser_local._7_1_ = false;
  }
  else if (tree_00->read_fn == (mpack_tree_read_t)0x0) {
    mpack_tree_flag_error(parser->tree,mpack_error_invalid);
    parser_local._7_1_ = false;
  }
  else {
    if (tree_00->buffer_capacity < tree_00->data_length + bytes) {
      if (tree_00->buffer_capacity == 0) {
        local_48 = (char *)0x1000;
      }
      else {
        local_48 = (char *)tree_00->buffer_capacity;
      }
      for (new_buffer = local_48; new_buffer < (char *)(tree_00->data_length + bytes);
          new_buffer = (char *)((long)new_buffer << 1)) {
      }
      if ((char *)tree_00->max_size < new_buffer) {
        new_buffer = (char *)tree_00->max_size;
      }
      if (tree_00->buffer == (char *)0x0) {
        read = (size_t)malloc((size_t)new_buffer);
      }
      else {
        read = (size_t)mpack_realloc(tree_00->buffer,tree_00->data_length,(size_t)new_buffer);
      }
      if (read == 0) {
        mpack_tree_flag_error(parser->tree,mpack_error_memory);
        return false;
      }
      tree_00->data = (char *)read;
      tree_00->buffer = (char *)read;
      tree_00->buffer_capacity = (size_t)new_buffer;
    }
    do {
      sVar2 = (*tree_00->read_fn)(tree_00,tree_00->buffer + tree_00->data_length,
                                  tree_00->buffer_capacity - tree_00->data_length);
      mVar1 = mpack_tree_error(tree_00);
      if (mVar1 != mpack_ok) {
        return false;
      }
      if ((sVar2 == 0) || (sVar2 == 0xffffffffffffffff)) {
        mpack_tree_flag_error(parser->tree,mpack_error_io);
        return false;
      }
      tree_00->data_length = sVar2 + tree_00->data_length;
      parser->possible_nodes_left = sVar2 + parser->possible_nodes_left;
    } while (parser->possible_nodes_left < bytes);
    parser->possible_nodes_left = parser->possible_nodes_left - bytes;
    parser_local._7_1_ = true;
  }
  return parser_local._7_1_;
}

Assistant:

static bool mpack_tree_reserve_fill(mpack_tree_parser_t* parser, size_t bytes) {
    mpack_assert(bytes > parser->possible_nodes_left,
            "there are already enough bytes! call mpack_tree_reserve_bytes() instead.");
    mpack_log("filling to reserve %i bytes\n", (int)bytes);
    mpack_tree_t* tree = parser->tree;

    // if the necessary bytes would put us over the maximum tree
    // size, fail right away.
    // TODO: check for overflow?
    if (tree->data_length + bytes > tree->max_size) {
        mpack_tree_flag_error(parser->tree, mpack_error_too_big);
        return false;
    }

    // we'll need a read function to fetch more data. if there's
    // no read function, the data should contain an entire message
    // (or messages), so we flag it as invalid.
    if (tree->read_fn == NULL) {
        mpack_log("tree has no read function!\n");
        mpack_tree_flag_error(parser->tree, mpack_error_invalid);
        return false;
    }

    // expand the buffer if needed
    if (tree->data_length + bytes > tree->buffer_capacity) {

        // TODO: check for overflow?
        size_t new_capacity = (tree->buffer_capacity == 0) ? MPACK_BUFFER_SIZE : tree->buffer_capacity;
        while (new_capacity < tree->data_length + bytes)
            new_capacity *= 2;
        if (new_capacity > tree->max_size)
            new_capacity = tree->max_size;

        mpack_log("expanding buffer from %i to %i\n", (int)tree->buffer_capacity, (int)new_capacity);

        char* new_buffer;
        if (tree->buffer == NULL)
            new_buffer = (char*)MPACK_MALLOC(new_capacity);
        else
            new_buffer = (char*)mpack_realloc(tree->buffer, tree->data_length, new_capacity);

        if (new_buffer == NULL) {
            mpack_tree_flag_error(parser->tree, mpack_error_memory);
            return false;
        }

        tree->data = new_buffer;
        tree->buffer = new_buffer;
        tree->buffer_capacity = new_capacity;
    }

    // request as much data as possible, looping until we have
    // all the data we need
    do {
        size_t read = tree->read_fn(tree, tree->buffer + tree->data_length, tree->buffer_capacity - tree->data_length);

        // As with the reader, node fill functions can flag an error or return
        // 0 on failure. We also guard against functions that -1 just in case.
        if (mpack_tree_error(tree) != mpack_ok)
            return false;
        if (read == 0 || read == (size_t)(-1)) {
            mpack_tree_flag_error(parser->tree, mpack_error_io);
            return false;
        }

        tree->data_length += read;
        parser->possible_nodes_left += read;
    } while (parser->possible_nodes_left < bytes);

    parser->possible_nodes_left -= bytes;
    return true;
}